

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::show_item_bottom(Fl_Tree *this,Fl_Tree_Item *item)

{
  int iVar1;
  int iVar2;
  undefined8 local_28;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  local_28 = item;
  if (item == (Fl_Tree_Item *)0x0) {
    local_28 = first(this);
  }
  if (local_28 != (Fl_Tree_Item *)0x0) {
    iVar1 = Fl_Widget::h((Fl_Widget *)this);
    iVar2 = Fl_Tree_Item::h(local_28);
    show_item(this,local_28,iVar1 - iVar2);
  }
  return;
}

Assistant:

void Fl_Tree::show_item_bottom(Fl_Tree_Item *item) {
  item = item ? item : first();
#if FLTK_ABI_VERSION >= 10303
  if (item) show_item(item, _tih-item->h());
#else
  if (item) show_item(item, h()-item->h());
#endif
}